

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O0

bool __thiscall DataSourceDOS::check(DataSourceDOS *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  uint uVar2;
  reference pbVar3;
  Stream *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  allocator<char> local_189;
  string local_188 [32];
  undefined1 local_168 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string file_path;
  string file_name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_e0;
  allocator<char> local_df;
  allocator<char> local_de;
  allocator<char> local_dd [20];
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  default_file_names;
  DataSourceDOS *this_local;
  
  local_e0 = 1;
  local_c8 = &local_c0;
  default_file_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"SPAE.PA",&local_c9);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"SPAF.PA",local_dd);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"SPAD.PA",&local_de);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"SPAU.PA",&local_df);
  local_e0 = 0;
  local_40 = &local_c0;
  local_38 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1 + 7));
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1 + 7));
  local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
  do {
    local_1e8 = local_1e8 + -1;
    std::__cxx11::string::~string((string *)local_1e8);
  } while (local_1e8 != &local_c0);
  std::allocator<char>::~allocator(&local_df);
  std::allocator<char>::~allocator(&local_de);
  std::allocator<char>::~allocator(local_dd);
  std::allocator<char>::~allocator(&local_c9);
  uVar2 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                    (this,&(this->super_DataSourceLegacy).super_DataSourceBase.path);
  if ((uVar2 & 1) == 0) {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_30);
    file_name.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&file_name.field_2 + 8)), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string((string *)(file_path.field_2._M_local_buf + 8),(string *)pbVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_168 + 8),&(this->super_DataSourceLegacy).super_DataSourceBase.path,'/');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_168 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&file_path.field_2 + 8));
      std::__cxx11::string::~string((string *)(local_168 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_188,"data",&local_189);
      Log::Logger::operator[]((Logger *)local_168,(string *)&Log::Info);
      pSVar4 = Log::Stream::operator<<((Stream *)local_168,"Looking for game data in \'");
      pSVar4 = Log::Stream::operator<<
                         (pSVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_140);
      Log::Stream::operator<<(pSVar4,"\'...");
      Log::Stream::~Stream((Stream *)local_168);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
      uVar2 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                        (this,local_140);
      bVar1 = (uVar2 & 1) != 0;
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)&(this->super_DataSourceLegacy).super_DataSourceBase.path,
                   (string *)local_140);
        this_local._7_1_ = 1;
      }
      __range1._0_4_ = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_140);
      if ((uint)__range1 == 0) {
        __range1._0_4_ = 0;
      }
      std::__cxx11::string::~string((string *)(file_path.field_2._M_local_buf + 8));
      if ((uint)__range1 != 0) goto LAB_001424a5;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 0;
    __range1._0_4_ = 1;
  }
  else {
    this_local._7_1_ = 1;
    __range1._0_4_ = 1;
  }
LAB_001424a5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
DataSourceDOS::check() {
  std::vector<std::string> default_file_names = {
    "SPAE.PA",  // English
    "SPAF.PA",  // French
    "SPAD.PA",  // German
    "SPAU.PA"   // Engish (US)
  };

  if (check_file(path)) {
    return true;
  }

  for (std::string file_name : default_file_names) {
    std::string file_path = path + '/' + file_name;
    Log::Info["data"] << "Looking for game data in '" << file_path << "'...";
    if (check_file(file_path)) {
      path = std::move(file_path);
      return true;
    }
  }

  return false;
}